

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cc
# Opt level: O0

void __thiscall klogic::mvn::mvn(mvn *this,int k,int N)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pcVar4;
  complex<double> local_50;
  __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_40;
  __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_38;
  iterator i;
  allocator<std::complex<double>_> local_19;
  int local_18;
  int local_14;
  int N_local;
  int k_local;
  mvn *this_local;
  
  local_18 = N;
  local_14 = k;
  _N_local = this;
  std::allocator<std::complex<double>_>::allocator(&local_19);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&this->weights,(long)(N + 1),&local_19);
  std::allocator<std::complex<double>_>::~allocator(&local_19);
  if (local_14 < 0 || local_18 < 0) {
    __assert_fail("k >= 0 && N >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mvn.cc",
                  10,"klogic::mvn::mvn(int, int)");
  }
  this->k = local_14;
  local_38._M_current =
       (complex<double> *)
       std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                 (&this->weights);
  while( true ) {
    local_40._M_current =
         (complex<double> *)
         std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::end
                   (&this->weights);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    iVar2 = rand();
    iVar3 = rand();
    std::complex<double>::complex
              (&local_50,(double)iVar2 / 2147483647.0,(double)iVar3 / 2147483647.0);
    pcVar4 = __gnu_cxx::
             __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
             ::operator*(&local_38);
    *(undefined8 *)pcVar4->_M_value = local_50._M_value._0_8_;
    *(undefined8 *)(pcVar4->_M_value + 8) = local_50._M_value._8_8_;
    __gnu_cxx::
    __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

klogic::mvn::mvn(int k, int N)
    : weights(N + 1)
{
    assert(k >= 0 && N >= 0);
    this->k = k;

    // Randomize weights
    for (cvector::iterator i = weights.begin(); i != weights.end(); ++i)
        *i = cmplx(double(rand()) / RAND_MAX, double(rand()) / RAND_MAX);
}